

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

void cppcms::xss::anon_unknown_8::parse_part(entry *part)

{
  pointer *pppVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  pointer ppVar7;
  ulong uVar8;
  byte *pbVar9;
  pointer ppVar10;
  long lVar11;
  int __base;
  char *p;
  byte *pbVar12;
  pointer ppVar13;
  pointer ppVar14;
  uint uVar15;
  pointer ppVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  bool bVar22;
  byte *local_60;
  uint local_54;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  ulong local_38;
  
  if (part->type == html_tag) {
    pcVar3 = part->begin;
    pcVar4 = part->end;
    pbVar17 = (byte *)(pcVar3 + 1);
    pbVar9 = (byte *)(pcVar4 + -1);
    if (pbVar17 < pbVar9) {
      bVar2 = *pbVar17;
      if (bVar2 == 0x2f) {
        if ((pcVar3[2] == 0x5f) || ((byte)((pcVar3[2] & 0xdfU) + 0xbf) < 0x1a)) {
          for (pbVar17 = (byte *)(pcVar3 + 3);
              (pbVar17 != pbVar9 &&
              (((byte)(*pbVar17 - 0x30) < 10 || ((byte)((*pbVar17 & 0xdf) + 0xbf) < 0x1a))));
              pbVar17 = pbVar17 + 1) {
          }
          pbVar12 = pbVar17;
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          if (pbVar12 == pbVar9) {
            (part->tag).tag_begin = pcVar3 + 2;
            (part->tag).tag_end = (char *)pbVar17;
            part->type = close_tag;
            return;
          }
        }
      }
      else if ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
        (part->tag).tag_begin = (char *)pbVar17;
        do {
          do {
            pbVar12 = pbVar17 + 1;
            pbVar17 = pbVar17 + 1;
          } while ((byte)(*pbVar12 - 0x30) < 10);
        } while ((byte)((*pbVar12 & 0xdf) + 0xbf) < 0x1a);
        (part->tag).tag_end = (char *)pbVar17;
        if (pcVar4[-2] == '/') {
          pbVar9 = (byte *)(pcVar4 + -2);
        }
        part->type = (uint)(pcVar4[-2] == '/') * 2 + open_tag;
        if (pbVar9 <= pbVar17) {
          return;
        }
        uVar8 = 1;
        do {
          bVar2 = *pbVar17;
          if (((ulong)bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar17 = pbVar17 + 1;
            bVar22 = false;
            uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
          }
          else if (((uVar8 & 1) == 0) || ((bVar2 != 0x5f && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))))
                  ) {
            part->type = invalid_data;
            bVar22 = true;
          }
          else {
            local_54 = (uint)uVar8;
            pbVar12 = pbVar17 + 2;
            pbVar20 = pbVar17;
            do {
              do {
                pbVar19 = pbVar20;
                pbVar21 = pbVar12;
                pbVar20 = pbVar19 + 1;
                pbVar12 = pbVar21 + 1;
              } while ((byte)(*pbVar19 - 0x30) < 10);
            } while ((byte)((*pbVar19 & 0xdf) + 0xbf) < 0x1a);
            ppVar10 = (part->tag).properties.
                      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar10 ==
                (part->tag).properties.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ppVar13 = (part->tag).properties.
                        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((long)ppVar10 - (long)ppVar13 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar18 = (long)ppVar10 - (long)ppVar13 >> 5;
              uVar8 = uVar18;
              if (ppVar10 == ppVar13) {
                uVar8 = 1;
              }
              local_38 = uVar8 + uVar18;
              if (0x3fffffffffffffe < local_38) {
                local_38 = 0x3ffffffffffffff;
              }
              if (CARRY8(uVar8,uVar18)) {
                local_38 = 0x3ffffffffffffff;
              }
              if (local_38 == 0) {
                ppVar7 = (pointer)0x0;
              }
              else {
                local_50 = ppVar10;
                local_48 = uVar18;
                local_40 = ppVar13;
                ppVar7 = (pointer)operator_new(local_38 << 5);
                ppVar10 = local_50;
                ppVar13 = local_40;
                uVar18 = local_48;
              }
              ppVar7[uVar18].property_begin = (char *)pbVar17;
              ppVar7[uVar18].property_end = (char *)pbVar19;
              ppVar7[uVar18].value_begin = (char *)0x0;
              (&ppVar7[uVar18].value_begin)[1] = (char *)0x0;
              ppVar14 = ppVar7;
              for (ppVar16 = ppVar13; ppVar10 != ppVar16; ppVar16 = ppVar16 + 1) {
                pcVar3 = ppVar16->property_begin;
                pcVar4 = ppVar16->property_end;
                pcVar5 = ppVar16->value_end;
                ppVar14->value_begin = ppVar16->value_begin;
                ppVar14->value_end = pcVar5;
                ppVar14->property_begin = pcVar3;
                ppVar14->property_end = pcVar4;
                ppVar14 = ppVar14 + 1;
              }
              if (ppVar13 != (pointer)0x0) {
                local_50 = ppVar7;
                operator_delete(ppVar13);
                ppVar7 = local_50;
              }
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar7;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar14 + 1;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7 + local_38;
            }
            else {
              ppVar10->property_begin = (char *)pbVar17;
              ppVar10->property_end = (char *)pbVar19;
              ppVar10->value_begin = (char *)0x0;
              ppVar10->value_end = (char *)0x0;
              pppVar1 = &(part->tag).properties.
                         super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            uVar8 = (ulong)*pbVar19;
            if (uVar8 < 0x3e) {
              bVar22 = false;
              if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
                if ((uVar8 != 0x3d) || ((bVar2 = *pbVar20, bVar2 != 0x22 && (bVar2 != 0x27))))
                goto LAB_00221a5c;
                pbVar20 = pbVar19 + 2;
                bVar22 = true;
                pbVar17 = pbVar20;
                if (pbVar20 < pbVar9) {
                  lVar11 = 2;
                  do {
                    pbVar17 = pbVar21;
                    if (*pbVar21 == bVar2) break;
                    lVar11 = lVar11 + 1;
                    pbVar21 = pbVar21 + 1;
                    pbVar17 = pbVar9;
                  } while (pbVar21 < pbVar9);
                  bVar22 = lVar11 == 2;
                }
                pbVar12 = pbVar20;
                if (pbVar17 == pbVar9) {
                  part->type = invalid_data;
                  bVar22 = true;
                }
                else {
                  while (local_60 = pbVar12, !bVar22) {
                    bVar2 = *local_60;
                    if (bVar2 == 0x26) {
                      local_60 = local_60 + 1;
                      bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"amp;");
                      if ((((!bVar6) &&
                           (bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"lt;"), !bVar6)) &&
                          (bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"gt;"), !bVar6)) &&
                         (((bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"quot;"), !bVar6 &&
                           (bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"apos;"), !bVar6))
                          && ((bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"#x27;"), !bVar6
                              && ((bVar6 = ends_with((char **)&local_60,(char *)pbVar17,"#X27;"),
                                  !bVar6 && (bVar6 = ends_with((char **)&local_60,(char *)pbVar17,
                                                               "#39;"), !bVar6)))))))) break;
                    }
                    else {
                      if ((bVar2 == 0x3c) || (bVar2 == 0x3e)) break;
                      local_60 = local_60 + 1;
                    }
                    pbVar12 = local_60;
                    bVar22 = local_60 == pbVar17;
                  }
                  if (bVar22) {
                    (part->tag).properties.
                    super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].value_begin = (char *)pbVar20;
                    (part->tag).properties.
                    super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].value_end = (char *)pbVar17;
                    uVar8 = 0;
                    bVar22 = false;
                    pbVar17 = pbVar17 + 1;
                    goto LAB_002216f4;
                  }
                  part->type = invalid_data;
                  bVar22 = true;
                }
              }
            }
            else {
LAB_00221a5c:
              part->type = invalid_data;
              bVar22 = true;
            }
            uVar8 = (ulong)local_54;
            pbVar17 = pbVar20;
          }
LAB_002216f4:
          if (bVar22) {
            return;
          }
          if (pbVar9 <= pbVar17) {
            return;
          }
        } while( true );
      }
    }
  }
  else {
    if (part->type != html_entity) {
      return;
    }
    pcVar3 = part->begin;
    pbVar17 = (byte *)(pcVar3 + 1);
    pbVar9 = (byte *)(part->end + -1);
    if (pbVar17 < pbVar9) {
      pbVar12 = pbVar17;
      if (*pbVar17 == 0x23) {
        local_60 = (byte *)0x0;
        part->type = html_numeric_entity;
        pbVar17 = (byte *)(pcVar3 + 2);
        if (pbVar17 != pbVar9) {
          pbVar12 = pbVar17;
          if ((*pbVar17 | 0x20) == 0x78) {
            pbVar17 = (byte *)(pcVar3 + 3);
            pbVar12 = pbVar17;
            if (pbVar17 == pbVar9) goto LAB_00221b64;
            do {
              if ((9 < (byte)(*pbVar12 - 0x30)) &&
                 ((uVar15 = *pbVar12 - 0x41, 0x25 < uVar15 ||
                  ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0)))) goto LAB_00221b64;
              pbVar12 = pbVar12 + 1;
            } while (pbVar12 != pbVar9);
            __base = 0x10;
          }
          else {
            do {
              if (9 < (byte)(*pbVar12 - 0x30)) goto LAB_00221b64;
              pbVar12 = pbVar12 + 1;
            } while (pbVar12 != pbVar9);
            __base = 10;
          }
          uVar8 = strtol((char *)pbVar17,(char **)&local_60,__base);
          if (((local_60 != (byte *)0x0) && ((long)uVar8 < 0x110000 && *local_60 == 0x3b)) &&
             (0x20 < uVar8 - 0x7f &&
              ((uVar8 & 0xfffffffffffffffe) != 0xfffe && (uVar8 & 0xfffffffffffffc00) != 0xd800))) {
            if (0x1f < (long)uVar8) {
              return;
            }
            if ((8 < (long)uVar8) && (uVar8 == 0xd || 0xfffffffffffffffd < uVar8 - 0xb)) {
              return;
            }
          }
        }
      }
      else {
        while( true ) {
          if (pbVar12 == pbVar9) {
            (part->tag).tag_begin = (char *)pbVar17;
            (part->tag).tag_end = (char *)pbVar9;
            return;
          }
          if ((9 < (byte)(*pbVar12 - 0x30)) && (0x19 < (byte)((*pbVar12 & 0xdf) + 0xbf))) break;
          pbVar12 = pbVar12 + 1;
        }
      }
    }
  }
LAB_00221b64:
  part->type = invalid_data;
  return;
}

Assistant:

void parse_part(entry &part)
		{
			switch(part.type) {
			case html_entity:
				parse_html_entity(part);
				break;
			case html_tag:
				parse_html_tag(part);
				break;
			default:
				/* Nothing to do in other cases */ ;
			}
		}